

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O1

bool __thiscall
SocketClient::writeTo(SocketClient *this,String *host,uint16_t port,uchar *f_data,uint size)

{
  size_t sVar1;
  element_type *peVar2;
  Buffer *this_00;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  SocketClient *pSVar6;
  uchar *puVar7;
  Log *pLVar8;
  shared_ptr<SocketClient> *args;
  uchar *puVar9;
  ulong uVar10;
  size_t __n;
  byte bVar11;
  uint uVar12;
  bool bVar13;
  char cVar14;
  int e;
  SharedPtr loop;
  SharedPtr socketPtr;
  Resolver resolver;
  int local_104;
  Log local_100;
  uint local_ec;
  ulong local_e8;
  uchar *local_e0;
  Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *local_d8;
  Log local_d0;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_c0;
  SharedPtr local_b8;
  Resolver local_a8;
  Log local_90;
  Log local_80;
  Log local_70;
  Buffer *local_60;
  ulong local_58;
  Log local_50;
  Log local_40;
  
  local_ec = size;
  local_e0 = f_data;
  if ((size == 0) == (f_data != (uchar *)0x0)) {
    __assert_fail("(!size) == (!data)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                  ,0x1b1,
                  "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                 );
  }
  pSVar6 = this;
  std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SocketClient,void>
            ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
  iVar5 = (int)pSVar6;
  Resolver::Resolver(&local_a8);
  if (port != 0) {
    Resolver::resolve(&local_a8,host,port,&local_b8);
    iVar5 = (int)host;
  }
  if (this->mWriteWait == false) {
    sVar1 = (this->mWriteBuffer).bufferSize;
    if (sVar1 != 0) {
      uVar10 = 0;
      local_e8 = sVar1 - this->mWriteOffset;
      if (local_e8 != 0) {
        local_d8 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                   &this->mSignalBytesWritten;
        uVar10 = 0;
        do {
          if ((this->mWriteBuffer).bufferSize <= uVar10) {
            __assert_fail("mWriteBuffer.size() > total",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                          ,0x1c6,
                          "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                         );
          }
          __n = local_e8 - uVar10;
          if (local_a8.addr == (sockaddr *)0x0) {
            do {
              puVar7 = (this->mWriteBuffer).bufferData + this->mWriteOffset + uVar10;
              sVar3 = ::write(this->mFd,puVar7,__n);
              iVar5 = (int)puVar7;
              local_104 = (int)sVar3;
              if (local_104 != -1) break;
              piVar4 = __errno_location();
            } while (*piVar4 == 4);
          }
          else {
            do {
              puVar7 = (this->mWriteBuffer).bufferData + this->mWriteOffset + uVar10;
              sVar3 = sendto(this->mFd,puVar7,__n,0x4000,(sockaddr *)local_a8.addr,
                             (socklen_t)local_a8.size);
              iVar5 = (int)puVar7;
              local_104 = (int)sVar3;
              if (local_104 != -1) break;
              piVar4 = __errno_location();
            } while (*piVar4 == 4);
          }
          if (this->mLogsEnabled == true) {
            local_c0.mValue = 1;
            Log::Log(&local_90,LogLevel::Debug,(Flags<LogOutput::LogFlag> *)&local_c0);
            Log::write(&local_80,(int)&local_90,"SENT(1)",0xffffffff);
            Log::addStringStream<unsigned_long>(&local_70,(unsigned_long)&local_80);
            Log::write(&local_d0,(int)&local_70,"BYTES",0xffffffff);
            pLVar8 = &local_100;
            Log::addStringStream<int>(pLVar8,(int)&local_d0);
            __errno_location();
            Log::addStringStream<int>(&local_40,(int)pLVar8);
            iVar5 = (int)pLVar8;
            if (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          args = &local_b8;
          if (local_104 == -1) {
            piVar4 = __errno_location();
            if (*piVar4 != 0xb) {
              std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<SocketClient,void>
                        ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&local_100,
                         (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
              local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_
                   = 5;
              pLVar8 = &local_100;
              Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
              operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                          *)&this->mSignalError,(shared_ptr<SocketClient> *)pLVar8,
                         (Error *)&local_d0);
              iVar5 = (int)pLVar8;
              if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              cVar14 = '\x01';
              close(this,iVar5);
              goto LAB_00163199;
            }
            if (this->mWMode == Synchronous) {
              EventLoop::eventLoop();
              if ((EventLoop *)
                  local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  == (EventLoop *)0x0) {
                cVar14 = '\0';
              }
              else {
                if ((int)uVar10 != 0) {
                  this->mWriteOffset = this->mWriteOffset + uVar10;
                }
                iVar5 = this->mFd;
                uVar12 = EventLoop::processSocket
                                   ((EventLoop *)
                                    local_100.mData.
                                    super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                    ,iVar5,-1);
                cVar14 = '\x03';
                uVar10 = 0;
                if ((uVar12 & 2) == 0) {
                  cVar14 = this->mFd == -1;
                }
              }
              if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              if (cVar14 != '\0') {
                if (cVar14 != '\x03') goto LAB_00163199;
                break;
              }
            }
            if (this->mWriteWait == true) {
              __assert_fail("!mWriteWait",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                            ,0x1e1,
                            "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                           );
            }
            EventLoop::eventLoop();
            if ((EventLoop *)
                local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (EventLoop *)0x0) {
              iVar5 = this->mFd;
              EventLoop::updateSocket
                        ((EventLoop *)
                         local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,iVar5,7);
              this->mWriteWait = true;
            }
            if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            break;
          }
          Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
                    (local_d8,args,&local_104);
          iVar5 = (int)args;
          uVar10 = (ulong)(uint)((int)uVar10 + local_104);
        } while (uVar10 < local_e8);
      }
      if ((int)uVar10 != 0) {
        if (local_e8 < uVar10) {
          __assert_fail("total <= writeBufferSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x1f2,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        if (uVar10 < local_e8) {
          this->mWriteOffset = this->mWriteOffset + uVar10;
        }
        else {
          this->mWriteOffset = 0;
          if (0x7ffff < (this->mWriteBuffer).bufferSize) {
            free((this->mWriteBuffer).bufferData);
            (this->mWriteBuffer).bufferData = (uchar *)0x0;
            (this->mWriteBuffer).bufferReserved = 0;
          }
          (this->mWriteBuffer).bufferSize = 0;
        }
      }
      cVar14 = '\0';
LAB_00163199:
      if (cVar14 != '\0') {
LAB_0016319e:
        bVar11 = 0;
        goto LAB_001633e8;
      }
    }
    bVar13 = this->mFd == -1;
    bVar11 = !bVar13;
    if (bVar13 || local_e0 == (uchar *)0x0) goto LAB_001633e8;
    if (local_ec == 0) {
      __assert_fail("data != 0 && size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                    ,0x201,
                    "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                   );
    }
    uVar12 = 0;
    port = 0;
    if ((this->mWriteBuffer).bufferSize == 0) {
      local_60 = &this->mWriteBuffer;
      local_d8 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                 &this->mSignalBytesWritten;
      local_e8 = local_e8 & 0xffffffff00000000;
      do {
        uVar12 = local_ec - (uint)local_e8;
        if (local_ec < (uint)local_e8 || uVar12 == 0) {
          __assert_fail("size > total",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x205,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        local_58 = local_e8 & 0xffffffff;
        puVar7 = local_e0 + local_58;
        if (local_a8.addr == (sockaddr *)0x0) {
          do {
            puVar9 = puVar7;
            sVar3 = ::write(this->mFd,puVar7,(ulong)uVar12);
            iVar5 = (int)puVar9;
            local_104 = (int)sVar3;
            if (local_104 != -1) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
        }
        else {
          do {
            puVar9 = puVar7;
            sVar3 = sendto(this->mFd,puVar7,(ulong)uVar12,0x4000,(sockaddr *)local_a8.addr,
                           (socklen_t)local_a8.size);
            iVar5 = (int)puVar9;
            local_104 = (int)sVar3;
            if (local_104 != -1) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
        }
        if (this->mLogsEnabled == true) {
          local_c0.mValue = 1;
          Log::Log(&local_90,LogLevel::Debug,(Flags<LogOutput::LogFlag> *)&local_c0);
          Log::write(&local_80,(int)&local_90,"SENT(2)",0xffffffff);
          Log::addStringStream<unsigned_int>(&local_70,(uint)&local_80);
          Log::write(&local_d0,(int)&local_70,"BYTES",0xffffffff);
          pLVar8 = &local_100;
          Log::addStringStream<int>(pLVar8,(int)&local_d0);
          __errno_location();
          Log::addStringStream<int>(&local_50,(int)pLVar8);
          iVar5 = (int)pLVar8;
          if (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (local_104 == -1) {
          piVar4 = __errno_location();
          if (*piVar4 != 0xb) {
            std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<SocketClient,void>
                      ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&local_100,
                       (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
            local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
                 5;
            pLVar8 = &local_100;
            Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
            operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                        *)&this->mSignalError,(shared_ptr<SocketClient> *)pLVar8,(Error *)&local_d0)
            ;
            iVar5 = (int)pLVar8;
            if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            close(this,iVar5);
            goto LAB_0016319e;
          }
          if (this->mWMode == Synchronous) {
            EventLoop::eventLoop();
            this_00 = local_60;
            peVar2 = local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((EventLoop *)
                local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (EventLoop *)0x0) {
LAB_00163613:
              port = 0;
            }
            else {
              uVar10 = (ulong)uVar12;
              if ((this->mMaxWriteBufferSize != 0) &&
                 (this->mMaxWriteBufferSize < (this->mWriteBuffer).bufferSize + uVar10)) {
                close(this,iVar5);
                goto LAB_00163613;
              }
              Buffer::reserve(local_60,(this->mWriteBuffer).bufferSize + uVar10);
              memcpy((this->mWriteBuffer).bufferData + (this->mWriteBuffer).bufferSize,
                     local_e0 + local_58,uVar10);
              Buffer::resize(this_00,uVar10 + (this->mWriteBuffer).bufferSize);
              if (this->mWriteOffset != 0) {
                __assert_fail("!mWriteOffset",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                              ,0x21e,
                              "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                             );
              }
              iVar5 = this->mFd;
              EventLoop::processSocket
                        ((EventLoop *)
                         local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,iVar5,-1);
              port = (uint16_t)(this->mFd != -1);
            }
            bVar11 = (byte)port;
            if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((EventLoop *)peVar2 != (EventLoop *)0x0) break;
          }
          else {
            port = 0;
          }
          if (this->mWriteWait == true) {
            __assert_fail("!mWriteWait",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                          ,0x224,
                          "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                         );
          }
          EventLoop::eventLoop();
          uVar12 = (uint)local_e8;
          if ((EventLoop *)
              local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (EventLoop *)0x0) {
            iVar5 = this->mFd;
            EventLoop::updateSocket
                      ((EventLoop *)
                       local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,iVar5,7);
            this->mWriteWait = true;
          }
          if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          goto LAB_00162e7d;
        }
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
                  (local_d8,&local_b8,&local_104);
        uVar12 = (uint)local_e8 + local_104;
        local_e8 = CONCAT44(local_e8._4_4_,uVar12);
        if (local_ec < uVar12) {
          __assert_fail("total <= size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x233,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        bVar11 = 1;
      } while (uVar12 != local_ec);
      goto LAB_001633e8;
    }
  }
  else {
    uVar12 = 0;
  }
LAB_00162e7d:
  bVar11 = (byte)port;
  bVar13 = uVar12 <= local_ec;
  local_ec = local_ec - uVar12;
  if (bVar13 && local_ec != 0) {
    uVar10 = (ulong)local_ec;
    if ((this->mMaxWriteBufferSize == 0) ||
       ((this->mWriteBuffer).bufferSize + uVar10 <= this->mMaxWriteBufferSize)) {
      Buffer::reserve(&this->mWriteBuffer,(this->mWriteBuffer).bufferSize + uVar10);
      memcpy((this->mWriteBuffer).bufferData + (this->mWriteBuffer).bufferSize,local_e0 + uVar12,
             uVar10);
      Buffer::resize(&this->mWriteBuffer,uVar10 + (this->mWriteBuffer).bufferSize);
      bVar13 = true;
    }
    else {
      close(this,iVar5);
      bVar13 = false;
      bVar11 = 0;
    }
    if (!bVar13) goto LAB_001633e8;
  }
  bVar11 = 1;
LAB_001633e8:
  Resolver::~Resolver(&local_a8);
  if (local_b8.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return (bool)(bVar11 & 1);
}

Assistant:

bool SocketClient::writeTo(const String& host, uint16_t port, const unsigned char* f_data, unsigned int size)
{
#ifdef _WIN32
    const char *data = reinterpret_cast<const char*>(f_data);
#else
    const unsigned char *data = f_data;
#endif

#ifdef RCT_SOCKETCLIENT_TIMING_ENABLED
    if (size) {
        mWrites.append(size);
    }
#endif

    assert((!size) == (!data));
    SocketClient::SharedPtr socketPtr = shared_from_this();

    Resolver resolver;
    if (port != 0)
        resolver.resolve(host, port, socketPtr);

    int e;
    unsigned int total = 0;

#ifdef HAVE_NOSIGNAL
    const int sendFlags = MSG_NOSIGNAL;
#else
    const int sendFlags = 0;
#endif

    if (!mWriteWait) {
        if (!mWriteBuffer.isEmpty()) {
            // assert(mWriteOffset < mWriteBuffer.size());
            const size_t writeBufferSize = mWriteBuffer.size() - mWriteOffset;
            while (total < writeBufferSize) {
                assert(mWriteBuffer.size() > total);
                if (resolver.addr) {
                    eintrwrap(e, ::sendto(mFd, reinterpret_cast<const char*>(mWriteBuffer.data()) + total + mWriteOffset, writeBufferSize - total,
                                          sendFlags, resolver.addr, resolver.size));
                } else {
                    eintrwrap(e, ::write(mFd, mWriteBuffer.data() + total + mWriteOffset, writeBufferSize - total));
                }
                DEBUG() << "SENT(1)" << (writeBufferSize - total) << "BYTES" << e << errno;
                if (e == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        if (mWMode == Synchronous) {
                            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                                if (total) {
                                    if (total < writeBufferSize) {
                                        mWriteOffset += total;
                                    } else {
                                        mWriteOffset = 0;
                                        mWriteBuffer.clear();
                                    }
                                    total = 0;
                                }
                                if (loop->processSocket(mFd) & EventLoop::SocketWrite)
                                    break;
                                if (mFd == -1)
                                    return false;
                            }
                        }
                        assert(!mWriteWait);
                        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
                            mWriteWait = true;
                        }
                        break;
                    } else {
                        // bad
                        mSignalError(shared_from_this(), WriteError);
                        close();
                        return false;
                    }
                }
                mSignalBytesWritten(socketPtr, e);
                total += e;
            }
            if (total) {
                assert(total <= writeBufferSize);
                if (total < writeBufferSize) {
                    mWriteOffset += total;
                } else {
                    mWriteOffset = 0;
                    mWriteBuffer.clear();
                }
            }
        }

        if (mFd == -1 || !data) {
            return mFd != -1;
        }
        total = 0;

        assert(data != 0 && size > 0);

        if (mWriteBuffer.isEmpty()) {
            for (;;) {
                assert(size > total);
                if (resolver.addr) {
                    eintrwrap(e, ::sendto(mFd, data + total, size - total,
                                          sendFlags, resolver.addr, resolver.size));
                } else {
#ifdef _WIN32
                    eintrwrap(e, ::send(mFd, data + total, size - total, 0));
#else
                    eintrwrap(e, ::write(mFd, data + total, size - total));
#endif
                }
                DEBUG() << "SENT(2)" << (size - total) << "BYTES" << e << errno;
                if (e == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        if (mWMode == Synchronous) {
                            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                                // store the rest
                                const unsigned int rem = size - total;
                                if (mMaxWriteBufferSize && mWriteBuffer.size() + rem > mMaxWriteBufferSize) {
                                    close();
                                    return false;
                                }
                                mWriteBuffer.reserve(mWriteBuffer.size() + rem);
                                memcpy(mWriteBuffer.end(), data + total, rem);
                                mWriteBuffer.resize(mWriteBuffer.size() + rem);
                                assert(!mWriteOffset);

                                (void)loop->processSocket(mFd);
                                return isConnected();
                            }
                        }
                        assert(!mWriteWait);
                        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
                            mWriteWait = true;
                        }
                        break;
                    } else {
                        // bad
                        mSignalError(shared_from_this(), WriteError);
                        close();
                        return false;
                    }
                }
                mSignalBytesWritten(socketPtr, e);
                total += e;
                assert(total <= size);
                if (total == size) {
                    // we're done
                    return true;
                }
            }
        }
    }

    if (total < size) {
        // store the rest
        const unsigned int rem = size - total;
        if (mMaxWriteBufferSize && mWriteBuffer.size() + rem > mMaxWriteBufferSize) {
            close();
            return false;
        }
        mWriteBuffer.reserve(mWriteBuffer.size() + rem);
        memcpy(mWriteBuffer.end(), data + total, rem);
        mWriteBuffer.resize(mWriteBuffer.size() + rem);
    }
    return true;
}